

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O3

Contrib_List *
crnlib::Resampler::make_clist
          (int src_x,int dst_x,Boundary_Op boundary_op,_func_Resample_Real_Resample_Real *Pfilter,
          Resample_Real filter_support,Resample_Real filter_scale,Resample_Real src_ofs)

{
  ushort uVar1;
  int iVar2;
  Contrib *pCVar3;
  Contrib_List *p;
  Contrib_List *pCVar4;
  uint uVar5;
  Contrib_List *pCVar6;
  int iVar7;
  Contrib *pCVar8;
  ulong uVar9;
  int iVar10;
  undefined8 *puVar11;
  Contrib_List *pCVar12;
  Contrib_List *pCVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Resample_Real RVar18;
  float fVar19;
  float fVar20;
  float local_94;
  float local_68;
  Contrib *local_40;
  
  p = (Contrib_List *)crnlib_calloc((long)dst_x,0x10,(size_t *)0x0);
  if (p == (Contrib_List *)0x0) {
    return (Contrib_List *)0x0;
  }
  pCVar4 = (Contrib_List *)crnlib_calloc((long)dst_x,0xc,(size_t *)0x0);
  pCVar6 = p;
  pCVar13 = (Contrib_List *)0x0;
  if (pCVar4 == (Contrib_List *)0x0) goto LAB_0014698e;
  fVar19 = 1.0 / filter_scale;
  fVar20 = (float)dst_x / (float)src_x;
  pCVar6 = pCVar4;
  pCVar13 = p;
  if (1.0 <= fVar20) {
    if (0 < dst_x) {
      puVar11 = (undefined8 *)&pCVar4->field_0x4;
      uVar9 = 0;
      iVar7 = 0;
      do {
        fVar14 = ((float)(int)uVar9 + 0.5) / fVar20 + -0.5 + src_ofs;
        fVar15 = floorf(fVar14 - filter_support * filter_scale);
        fVar16 = ceilf(filter_support * filter_scale + fVar14);
        *(float *)((long)puVar11 + -4) = fVar14;
        *puVar11 = CONCAT44((int)fVar16,(int)fVar15);
        iVar7 = (iVar7 - (int)fVar15) + (int)fVar16 + 1;
        uVar9 = uVar9 + 1;
        puVar11 = (undefined8 *)((long)puVar11 + 0xc);
      } while ((uint)dst_x != uVar9);
      if ((iVar7 != 0) &&
         (local_40 = (Contrib *)crnlib_calloc((long)iVar7,8,(size_t *)0x0),
         local_40 != (Contrib *)0x0)) {
        if (0 < dst_x) {
          uVar9 = 0;
          pCVar8 = local_40;
          do {
            fVar20 = *(float *)(&pCVar4->n + uVar9 * 6);
            iVar7 = *(int *)(&pCVar4->field_0x4 + uVar9 * 0xc);
            iVar2 = *(int *)((long)&pCVar4->p + uVar9 * 0xc);
            p[uVar9].n = 0;
            p[uVar9].p = pCVar8;
            if (iVar2 < iVar7) goto LAB_00146977;
            pCVar12 = p + uVar9;
            pCVar8 = pCVar8 + ((iVar2 - iVar7) + 1);
            fVar14 = 0.0;
            iVar10 = iVar7;
            do {
              RVar18 = (*Pfilter)((fVar20 - (float)iVar10) * fVar19);
              fVar14 = fVar14 + RVar18;
              iVar10 = iVar10 + 1;
            } while (iVar2 + 1 != iVar10);
            if (iVar2 < iVar7) goto LAB_00146977;
            local_94 = 0.0;
            uVar5 = 0xffffffff;
            fVar15 = -1e+20;
            do {
              RVar18 = (*Pfilter)((fVar20 - (float)iVar7) * fVar19);
              fVar16 = RVar18 * (1.0 / fVar14);
              if ((fVar16 != 0.0) || (NAN(fVar16))) {
                iVar10 = reflect(iVar7,src_x,boundary_op);
                uVar1 = pCVar12->n;
                pCVar12->n = uVar1 + 1;
                pCVar3 = pCVar12->p;
                pCVar3[uVar1].pixel = (unsigned_short)iVar10;
                pCVar3[uVar1].weight = fVar16;
                local_94 = local_94 + fVar16;
                if (fVar15 < fVar16) {
                  uVar5 = (uint)uVar1;
                  fVar15 = fVar16;
                }
              }
              iVar7 = iVar7 + 1;
            } while (iVar2 + 1 != iVar7);
            if ((uVar5 == 0xffffffff) || (pCVar12->n == 0)) goto LAB_00146977;
            if ((local_94 != 1.0) || (NAN(local_94))) {
              pCVar12->p[uVar5].weight = (1.0 - local_94) + pCVar12->p[uVar5].weight;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uint)dst_x);
        }
        goto LAB_0014698e;
      }
    }
  }
  else if (0 < dst_x) {
    fVar14 = (filter_support / fVar20) * filter_scale;
    puVar11 = (undefined8 *)&pCVar4->field_0x4;
    uVar9 = 0;
    iVar7 = 0;
    do {
      fVar15 = ((float)(int)uVar9 + 0.5) / fVar20 + -0.5 + src_ofs;
      fVar16 = floorf(fVar15 - fVar14);
      fVar17 = ceilf(fVar14 + fVar15);
      *(float *)((long)puVar11 + -4) = fVar15;
      *puVar11 = CONCAT44((int)fVar17,(int)fVar16);
      iVar7 = (iVar7 - (int)fVar16) + (int)fVar17 + 1;
      uVar9 = uVar9 + 1;
      puVar11 = (undefined8 *)((long)puVar11 + 0xc);
    } while ((uint)dst_x != uVar9);
    if ((iVar7 != 0) &&
       (local_40 = (Contrib *)crnlib_calloc((long)iVar7,8,(size_t *)0x0), local_40 != (Contrib *)0x0
       )) {
      if (0 < dst_x) {
        uVar9 = 0;
        pCVar8 = local_40;
        do {
          fVar14 = *(float *)(&pCVar4->n + uVar9 * 6);
          iVar7 = *(int *)(&pCVar4->field_0x4 + uVar9 * 0xc);
          iVar2 = *(int *)((long)&pCVar4->p + uVar9 * 0xc);
          p[uVar9].n = 0;
          p[uVar9].p = pCVar8;
          if (iVar2 < iVar7) goto LAB_00146977;
          pCVar12 = p + uVar9;
          pCVar8 = pCVar8 + ((iVar2 - iVar7) + 1);
          fVar15 = 0.0;
          iVar10 = iVar7;
          do {
            RVar18 = (*Pfilter)((fVar14 - (float)iVar10) * fVar20 * fVar19);
            fVar15 = fVar15 + RVar18;
            iVar10 = iVar10 + 1;
          } while (iVar2 + 1 != iVar10);
          if (iVar2 < iVar7) goto LAB_00146977;
          local_68 = 0.0;
          uVar5 = 0xffffffff;
          fVar16 = -1e+20;
          do {
            RVar18 = (*Pfilter)((fVar14 - (float)iVar7) * fVar20 * fVar19);
            fVar17 = RVar18 * (1.0 / fVar15);
            if ((fVar17 != 0.0) || (NAN(fVar17))) {
              iVar10 = reflect(iVar7,src_x,boundary_op);
              uVar1 = pCVar12->n;
              pCVar12->n = uVar1 + 1;
              pCVar3 = pCVar12->p;
              pCVar3[uVar1].pixel = (unsigned_short)iVar10;
              pCVar3[uVar1].weight = fVar17;
              local_68 = local_68 + fVar17;
              if (fVar16 < fVar17) {
                uVar5 = (uint)uVar1;
                fVar16 = fVar17;
              }
            }
            iVar7 = iVar7 + 1;
          } while (iVar2 + 1 != iVar7);
          if ((uVar5 == 0xffffffff) || (pCVar12->n == 0)) goto LAB_00146977;
          if ((local_68 != 1.0) || (NAN(local_68))) {
            pCVar12->p[uVar5].weight = (1.0 - local_68) + pCVar12->p[uVar5].weight;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)dst_x);
      }
      goto LAB_0014698e;
    }
  }
LAB_00146981:
  crnlib_free(p);
  pCVar13 = (Contrib_List *)0x0;
LAB_0014698e:
  crnlib_free(pCVar6);
  return pCVar13;
LAB_00146977:
  crnlib_free(local_40);
  goto LAB_00146981;
}

Assistant:

Resampler::Contrib_List* Resampler::make_clist(
        int src_x, int dst_x, Boundary_Op boundary_op,
        Resample_Real (*Pfilter)(Resample_Real),
        Resample_Real filter_support,
        Resample_Real filter_scale,
        Resample_Real src_ofs)
    {
        typedef struct
        {
            // The center of the range in DISCRETE coordinates (pixel center = 0.0f).
            Resample_Real center;
            int left, right;
        } Contrib_Bounds;

        int i, j, k, n, left, right;
        Resample_Real total_weight;
        Resample_Real xscale, center, half_width, weight;
        Contrib_List* Pcontrib;
        Contrib* Pcpool;
        Contrib* Pcpool_next;
        Contrib_Bounds* Pcontrib_bounds;

        if ((Pcontrib = (Contrib_List*)crnlib_calloc(dst_x, sizeof(Contrib_List))) == nullptr)
        {
            return nullptr;
        }

        Pcontrib_bounds = (Contrib_Bounds*)crnlib_calloc(dst_x, sizeof(Contrib_Bounds));
        if (!Pcontrib_bounds)
        {
            crnlib_free(Pcontrib);
            return (nullptr);
        }

        const Resample_Real oo_filter_scale = 1.0f / filter_scale;

        const Resample_Real NUDGE = 0.5f;
        xscale = dst_x / (Resample_Real)src_x;

        if (xscale < 1.0f)
        {
            int total;
            (void)total;

            /* Handle case when there are fewer destination
         * samples than source samples (downsampling/minification).
         */

            // stretched half width of filter
            half_width = (filter_support / xscale) * filter_scale;

            // Find the range of source sample(s) that will contribute to each destination sample.

            for (i = 0, n = 0; i < dst_x; i++)
            {
                // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
                center = ((Resample_Real)i + NUDGE) / xscale;
                center -= NUDGE;
                center += src_ofs;

                left = cast_to_int((Resample_Real)floor(center - half_width));
                right = cast_to_int((Resample_Real)ceil(center + half_width));

                Pcontrib_bounds[i].center = center;
                Pcontrib_bounds[i].left = left;
                Pcontrib_bounds[i].right = right;

                n += (right - left + 1);
            }

            /* Allocate memory for contributors. */

            if ((n == 0) || ((Pcpool = (Contrib*)crnlib_calloc(n, sizeof(Contrib))) == nullptr))
            {
                crnlib_free(Pcontrib);
                crnlib_free(Pcontrib_bounds);
                return nullptr;
            }
            total = n;

            Pcpool_next = Pcpool;

            /* Create the list of source samples which
         * contribute to each destination sample.
         */

            for (i = 0; i < dst_x; i++)
            {
                int max_k = -1;
                Resample_Real max_w = -1e+20f;

                center = Pcontrib_bounds[i].center;
                left = Pcontrib_bounds[i].left;
                right = Pcontrib_bounds[i].right;

                Pcontrib[i].n = 0;
                Pcontrib[i].p = Pcpool_next;
                Pcpool_next += (right - left + 1);
                resampler_assert((Pcpool_next - Pcpool) <= total);

                total_weight = 0;

                for (j = left; j <= right; j++)
                {
                    total_weight += (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale);
                }
                const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

                total_weight = 0;

#if RESAMPLER_DEBUG
                printf("%i: ", i);
#endif

                for (j = left; j <= right; j++)
                {
                    weight = (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale) * norm;
                    if (weight == 0.0f)
                    {
                        continue;
                    }

                    n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
                    printf("%i(%f), ", n, weight);
#endif

                    /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

                    k = Pcontrib[i].n++;

                    Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
                    Pcontrib[i].p[k].weight = weight; /* store src sample weight */

                    total_weight += weight; /* total weight of all contributors */

                    if (weight > max_w)
                    {
                        max_w = weight;
                        max_k = k;
                    }
                }

#if RESAMPLER_DEBUG
                printf("\n\n");
#endif

                //resampler_assert(Pcontrib[i].n);
                //resampler_assert(max_k != -1);
                if ((max_k == -1) || (Pcontrib[i].n == 0))
                {
                    crnlib_free(Pcpool);
                    crnlib_free(Pcontrib);
                    crnlib_free(Pcontrib_bounds);
                    return nullptr;
                }

                if (total_weight != 1.0f)
                {
                    Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
                }
            }
        }
        else
        {
            /* Handle case when there are more
         * destination samples than source
         * samples (upsampling).
         */

            half_width = filter_support * filter_scale;

            // Find the source sample(s) that contribute to each destination sample.

            for (i = 0, n = 0; i < dst_x; i++)
            {
                // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
                center = ((Resample_Real)i + NUDGE) / xscale;
                center -= NUDGE;
                center += src_ofs;

                left = cast_to_int((Resample_Real)floor(center - half_width));
                right = cast_to_int((Resample_Real)ceil(center + half_width));

                Pcontrib_bounds[i].center = center;
                Pcontrib_bounds[i].left = left;
                Pcontrib_bounds[i].right = right;

                n += (right - left + 1);
            }

            /* Allocate memory for contributors. */

            int total = n;
            if ((total == 0) || ((Pcpool = (Contrib*)crnlib_calloc(total, sizeof(Contrib))) == nullptr))
            {
                crnlib_free(Pcontrib);
                crnlib_free(Pcontrib_bounds);
                return nullptr;
            }

            Pcpool_next = Pcpool;

            /* Create the list of source samples which
         * contribute to each destination sample.
         */

            for (i = 0; i < dst_x; i++)
            {
                int max_k = -1;
                Resample_Real max_w = -1e+20f;

                center = Pcontrib_bounds[i].center;
                left = Pcontrib_bounds[i].left;
                right = Pcontrib_bounds[i].right;

                Pcontrib[i].n = 0;
                Pcontrib[i].p = Pcpool_next;
                Pcpool_next += (right - left + 1);
                resampler_assert((Pcpool_next - Pcpool) <= total);

                total_weight = 0;
                for (j = left; j <= right; j++)
                {
                    total_weight += (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale);
                }

                const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

                total_weight = 0;

#if RESAMPLER_DEBUG
                printf("%i: ", i);
#endif

                for (j = left; j <= right; j++)
                {
                    weight = (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale) * norm;
                    if (weight == 0.0f)
                    {
                        continue;
                    }

                    n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
                    printf("%i(%f), ", n, weight);
#endif

                    /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

                    k = Pcontrib[i].n++;

                    Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
                    Pcontrib[i].p[k].weight = weight; /* store src sample weight */

                    total_weight += weight; /* total weight of all contributors */

                    if (weight > max_w)
                    {
                        max_w = weight;
                        max_k = k;
                    }
                }

#if RESAMPLER_DEBUG
                printf("\n\n");
#endif

                //resampler_assert(Pcontrib[i].n);
                //resampler_assert(max_k != -1);

                if ((max_k == -1) || (Pcontrib[i].n == 0))
                {
                    crnlib_free(Pcpool);
                    crnlib_free(Pcontrib);
                    crnlib_free(Pcontrib_bounds);
                    return nullptr;
                }

                if (total_weight != 1.0f)
                {
                    Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
                }
            }
        }

#if RESAMPLER_DEBUG
        printf("*******\n");
#endif

        crnlib_free(Pcontrib_bounds);

        return Pcontrib;
    }